

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O0

void andyzip::brotli_decoder::inverse_move_to_front(uint8_t *values,int num_values)

{
  byte local_121;
  int local_120;
  uint8_t value;
  int iStack_11c;
  uint8_t index;
  int i_1;
  int i;
  uint8_t mtf [256];
  int num_values_local;
  uint8_t *values_local;
  
  mtf._252_4_ = num_values;
  for (iStack_11c = 0; iStack_11c < 0x100; iStack_11c = iStack_11c + 1) {
    *(char *)((long)&i_1 + (long)iStack_11c) = (char)iStack_11c;
  }
  for (local_120 = 0; local_120 < num_values; local_120 = local_120 + 1) {
    local_121 = values[local_120];
    i_1._0_1_ = *(uint8_t *)((long)&i_1 + (ulong)local_121);
    values[local_120] = (uint8_t)i_1;
    for (; local_121 != 0; local_121 = local_121 - 1) {
      *(undefined1 *)((long)&i_1 + (ulong)local_121) =
           *(undefined1 *)((long)&i_1 + (long)(int)(local_121 - 1));
    }
  }
  return;
}

Assistant:

static void inverse_move_to_front(uint8_t values[], int num_values) {
      uint8_t mtf[256];
      for (int i = 0; i < 256; ++i) {
        mtf[i] = (uint8_t)i;
      }
      for (int i = 0; i < num_values; ++i) {
        uint8_t index = values[i];
        uint8_t value = mtf[index];
        values[i] = value;
        for (; index; --index) {
          mtf[index] = mtf[index - 1];
        }
        mtf[0] = value;
      }
    }